

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall
testing::internal::ExpectationBase::DescribeCallCountTo(ExpectationBase *this,ostream *os)

{
  CardinalityInterface *pCVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  std::__ostream_insert<char,std::char_traits<char>>(os,"         Expected: to be ",0x19);
  pCVar1 = (this->cardinality_).impl_.value_;
  (*pCVar1->_vptr_CardinalityInterface[6])(pCVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  Cardinality::DescribeActualCallCountTo(this->call_count_,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," - ",3);
  bVar2 = IsOverSaturated(this);
  if (bVar2) {
    pcVar5 = "over-saturated";
  }
  else {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    pCVar1 = (this->cardinality_).impl_.value_;
    iVar3 = (*pCVar1->_vptr_CardinalityInterface[5])(pCVar1,(ulong)(uint)this->call_count_);
    if ((char)iVar3 == '\0') {
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      pCVar1 = (this->cardinality_).impl_.value_;
      iVar3 = (*pCVar1->_vptr_CardinalityInterface[4])(pCVar1,(ulong)(uint)this->call_count_);
      pcVar5 = "unsatisfied";
      if ((char)iVar3 != '\0') {
        pcVar5 = "satisfied";
      }
    }
    else {
      pcVar5 = "saturated";
    }
  }
  sVar4 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(os," and ",5);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  pcVar5 = "active";
  if ((ulong)this->retired_ != 0) {
    pcVar5 = "retired";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)this->retired_ | 6);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();

  // Describes how many times the function is expected to be called.
  *os << "         Expected: to be ";
  cardinality().DescribeTo(os);
  *os << "\n           Actual: ";
  Cardinality::DescribeActualCallCountTo(call_count(), os);

  // Describes the state of the expectation (e.g. is it satisfied?
  // is it active?).
  *os << " - " << (IsOverSaturated() ? "over-saturated" :
                   IsSaturated() ? "saturated" :
                   IsSatisfied() ? "satisfied" : "unsatisfied")
      << " and "
      << (is_retired() ? "retired" : "active");
}